

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_stop__jack(ma_device *pDevice)

{
  int iVar1;
  ma_result in_ECX;
  ma_result mVar2;
  
  iVar1 = (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
  if (iVar1 == 0) {
    mVar2 = 0;
    if (pDevice->onStop != (ma_stop_proc)0x0) {
      (*pDevice->onStop)(pDevice);
      mVar2 = 0;
    }
  }
  else {
    ma_post_error(pDevice,1,"[JACK] An error occurred when deactivating the JACK client.",in_ECX);
    mVar2 = -1;
  }
  return mVar2;
}

Assistant:

static ma_result ma_device_stop__jack(ma_device* pDevice)
{
    ma_context* pContext = pDevice->pContext;
    ma_stop_proc onStop;

    if (((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient) != 0) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] An error occurred when deactivating the JACK client.", MA_ERROR);
    }
    
    onStop = pDevice->onStop;
    if (onStop) {
        onStop(pDevice);
    }

    return MA_SUCCESS;
}